

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_parser.cpp
# Opt level: O2

void __thiscall
HawkTracer::ClientUtils::CommandLineParser::register_option
          (CommandLineParser *this,string *name,OptionInfo *option_info)

{
  ostream *poVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>
  local_60;
  
  if ((option_info->is_flag == true) && (option_info->is_mandatory == true)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Unable to register option ");
    poVar1 = std::operator<<(poVar1,(string *)name);
    poVar1 = std::operator<<(poVar1,": option can\'t be flag and mandatory at the same time");
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo,_true>
            (&local_60,name,option_info);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,HawkTracer::ClientUtils::CommandLineParser::OptionInfo>,std::allocator<std::pair<std::__cxx11::string_const,HawkTracer::ClientUtils::CommandLineParser::OptionInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string,HawkTracer::ClientUtils::CommandLineParser::OptionInfo>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,HawkTracer::ClientUtils::CommandLineParser::OptionInfo>,std::allocator<std::pair<std::__cxx11::string_const,HawkTracer::ClientUtils::CommandLineParser::OptionInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this,&local_60);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>
  ::~pair(&local_60);
  return;
}

Assistant:

void CommandLineParser::register_option(std::string name, OptionInfo option_info)
{
    if (option_info.is_flag && option_info.is_mandatory)
    {
        std::cerr << "Unable to register option " << name
                  << ": option can't be flag and mandatory at the same time" << std::endl;
    }
    else
    {
        _registered_options.insert(std::make_pair(std::move(name), std::move(option_info)));
    }
}